

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O0

ktx_error_code_e
ktxTexture2_GLUpload(ktxTexture2 *This,GLuint *pTexture,GLenum *pTarget,GLenum *pGlerror)

{
  GLenum GVar1;
  GLenum GVar2;
  long in_RDX;
  long in_RDI;
  GLenum *unaff_retaddr;
  ktx_glformatinfo formatInfo;
  ktx_error_code_e result;
  GLint previousUnpackAlignment;
  PFNGLGETPROCADDRESS in_stack_ffffffffffffffb8;
  int local_2c [7];
  long local_10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ktx_error_code_e kVar3;
  
  if (in_RDI == 0) {
    kVar3 = KTX_INVALID_VALUE;
  }
  else if (in_RDX == 0) {
    kVar3 = KTX_INVALID_VALUE;
  }
  else {
    local_10 = in_RDI;
    kVar3 = ktxLoadOpenGL(in_stack_ffffffffffffffb8);
    if (kVar3 == KTX_SUCCESS) {
      if (*(int *)(local_10 + 0x78) == 0) {
        kVar3 = KTX_INVALID_OPERATION;
      }
      else {
        GVar1 = vkFormat2glInternalFormat(*(VkFormat *)(local_10 + 0x78));
        if (GVar1 == 0x501) {
          kVar3 = KTX_INVALID_OPERATION;
        }
        else {
          if ((*(byte *)(local_10 + 0x22) & 1) == 0) {
            GVar1 = vkFormat2glFormat(*(VkFormat *)(local_10 + 0x78));
            GVar2 = vkFormat2glType(*(VkFormat *)(local_10 + 0x78));
            if ((GVar1 == 0x501) || (GVar2 == 0x501)) {
              return KTX_INVALID_OPERATION;
            }
          }
          (*gl.glGetIntegerv)(0xcf5,local_2c);
          if (local_2c[0] != 1) {
            (*gl.glPixelStorei)(0xcf5,1);
          }
          kVar3 = ktxTexture_GLUploadPrivate
                            (_result,(ktx_glformatinfo *)formatInfo._8_8_,(GLuint *)formatInfo._0_8_
                             ,unaff_retaddr,
                             (GLenum *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                            );
          if (local_2c[0] != 1) {
            (*gl.glPixelStorei)(0xcf5,local_2c[0]);
          }
        }
      }
    }
  }
  return kVar3;
}

Assistant:

KTX_error_code
ktxTexture2_GLUpload(ktxTexture2* This, GLuint* pTexture, GLenum* pTarget,
                     GLenum* pGlerror)
{
    GLint                 previousUnpackAlignment;
    ktx_error_code_e      result = KTX_SUCCESS;
    ktx_glformatinfo      formatInfo;

    if (!This) {
        return KTX_INVALID_VALUE;
    }

    if (!pTarget) {
        return KTX_INVALID_VALUE;
    }

    result = ktxLoadOpenGL(NULL);
    if (result != KTX_SUCCESS) {
        return result;
    }

    if (This->vkFormat != VK_FORMAT_UNDEFINED) {
        formatInfo.glInternalformat =
                            vkFormat2glInternalFormat(This->vkFormat);
        if (formatInfo.glInternalformat == GL_INVALID_VALUE) {
            // TODO Check for mapping metadata. If none
            return KTX_INVALID_OPERATION;
        }
    } else {
       // TODO: Check DFD for ASTC HDR or 3D or RGB[DEM] and figure out format.
       return KTX_INVALID_OPERATION; // BasisU textures must be transcoded
                                     // before upload.
    }

    if (This->isCompressed) {
        /* Unused. */
        formatInfo.glFormat = GL_INVALID_VALUE;
        formatInfo.glType = GL_INVALID_VALUE;
        formatInfo.glBaseInternalformat = GL_INVALID_VALUE;
    } else {
        formatInfo.glFormat = vkFormat2glFormat(This->vkFormat);
        formatInfo.glType = vkFormat2glType(This->vkFormat);
        formatInfo.glBaseInternalformat = formatInfo.glInternalformat;

        if (formatInfo.glFormat == GL_INVALID_VALUE || formatInfo.glType == GL_INVALID_VALUE)
            return KTX_INVALID_OPERATION;
    }
    /* KTX 2 files require an unpack alignment of 1. OGL default is 4. */
    glGetIntegerv(GL_UNPACK_ALIGNMENT, &previousUnpackAlignment);
    if (previousUnpackAlignment != 1) {
        glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
    }

    result = ktxTexture_GLUploadPrivate(ktxTexture(This), &formatInfo,
                                        pTexture, pTarget, pGlerror);

    /* restore previous GL state */
    if (previousUnpackAlignment != 1) {
        glPixelStorei(GL_UNPACK_ALIGNMENT, previousUnpackAlignment);
    }

    return result;
}